

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O2

void __thiscall
LNodeF0Stmt::LNodeF0Stmt
          (LNodeF0Stmt *this,shared_ptr<LNode> *var,shared_ptr<LNode> *from_expr,
          shared_ptr<LNode> *to_expr,shared_ptr<LNode> *stmts)

{
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->var).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             &var->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->from_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>,
             &from_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->to_expr).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>,
             &to_expr->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->stmts).super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>,
             &stmts->super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

LNodeF0Stmt(std::shared_ptr<LNode> var, std::shared_ptr<LNode> from_expr,
                std::shared_ptr<LNode> to_expr, std::shared_ptr<LNode> stmts) {
        this->var = std::move(var);
        this->from_expr = std::move(from_expr);
        this->to_expr = std::move(to_expr);
        this->stmts = std::move(stmts);
    }